

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeBinfmt>
               (undefined8 stream,
               vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
               *arg)

{
  bool bVar1;
  plotting_empty_container *this;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_38;
  size_t i;
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>
  *arg_local;
  ostream *stream_local;
  
  bVar1 = std::
          vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
          ::empty(arg);
  if (bVar1) {
    this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
    plotting_empty_container::plotting_empty_container(this);
    __cxa_throw(this,&plotting_empty_container::typeinfo,
                plotting_empty_container::~plotting_empty_container);
  }
  for (local_38 = 0;
      sVar2 = std::
              vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
              ::size(arg), local_38 < sVar2; local_38 = local_38 + 1) {
    pvVar3 = std::
             vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
             ::operator[](arg,local_38);
    deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeBinfmt>
              (stream,pvVar3);
  }
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}